

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

uint AddBaseClassMemberVariables
               (ExpressionContext *ctx,SynBase *syntax,TypeClass *baseClass,TypeClass *newClass)

{
  longlong *plVar1;
  uint alignment;
  uint uniqueId;
  SynIdentifier *pSVar2;
  VariableData *pVVar3;
  TypeBase *type;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  MemberHandle *node;
  ulong uVar7;
  uint uVar8;
  char *in_R8;
  MemberHandle *pMVar9;
  InplaceStr name;
  InplaceStr local_40;
  VariableData *this;
  undefined4 extraout_var_00;
  
  uVar8 = 0;
  uVar5 = 0;
  if (baseClass->baseClass != (TypeClass *)0x0) {
    uVar5 = AddBaseClassMemberVariables(ctx,syntax,baseClass->baseClass,newClass);
  }
  pMVar9 = (baseClass->super_TypeStruct).members.head;
  if (pMVar9 != (MemberHandle *)0x0) {
    uVar8 = 0;
    do {
      local_40.begin = "$typeid";
      local_40.end = "";
      bVar4 = InplaceStr::operator==(&pMVar9->variable->name->name,&local_40);
      if (!bVar4) {
        uVar8 = uVar8 + 1;
        if (uVar5 == 0) {
          pSVar2 = pMVar9->variable->name;
          name.end = in_R8;
          name.begin = (pSVar2->name).end;
          bVar4 = anon_unknown.dwarf_9fd58::CheckVariableConflict
                            ((anon_unknown_dwarf_9fd58 *)ctx,(ExpressionContext *)syntax,
                             (SynBase *)(pSVar2->name).begin,name);
          uVar5 = anon_unknown.dwarf_9fd58::AllocateVariableInScope
                            (ctx,syntax,pMVar9->variable->alignment,pMVar9->variable->type);
          if (uVar5 != pMVar9->variable->offset) {
            __assert_fail("offset == el->variable->offset",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x2981,
                          "unsigned int AddBaseClassMemberVariables(ExpressionContext &, SynBase *, TypeClass *, TypeClass *)"
                         );
          }
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
          this = (VariableData *)CONCAT44(extraout_var,iVar6);
          pVVar3 = pMVar9->variable;
          alignment = pVVar3->alignment;
          in_R8 = (char *)(ulong)alignment;
          type = pVVar3->type;
          pSVar2 = pVVar3->name;
          uniqueId = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uniqueId + 1;
          VariableData::VariableData
                    (this,ctx->allocator,syntax,ctx->scope,alignment,type,pSVar2,uVar5,uniqueId);
          if (!bVar4) {
            ExpressionContext::AddVariable(ctx,this,true);
          }
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
          node = (MemberHandle *)CONCAT44(extraout_var_00,iVar6);
          node->source = pMVar9->variable->source;
          node->variable = this;
          node->initializer = (SynBase *)0x0;
          node->next = (MemberHandle *)0x0;
          node->listed = false;
          IntrusiveList<MemberHandle>::push_back(&(newClass->super_TypeStruct).members,node);
          uVar5 = 0;
        }
        else {
          uVar5 = uVar5 - 1;
        }
      }
      pMVar9 = pMVar9->next;
    } while (pMVar9 != (MemberHandle *)0x0);
  }
  uVar7 = (ulong)(baseClass->super_TypeStruct).super_TypeBase.padding;
  plVar1 = &((newClass->super_TypeStruct).typeScope)->dataSize;
  *plVar1 = *plVar1 + uVar7;
  plVar1 = &(newClass->super_TypeStruct).super_TypeBase.size;
  *plVar1 = *plVar1 + uVar7;
  return uVar8;
}

Assistant:

unsigned AddBaseClassMemberVariables(ExpressionContext &ctx, SynBase *syntax, TypeClass *baseClass, TypeClass *newClass)
{
	unsigned skipBaseMembers = 0;

	if(baseClass->baseClass)
		skipBaseMembers = AddBaseClassMemberVariables(ctx, syntax, baseClass->baseClass, newClass);

	unsigned skipMembers = 0;

	for(MemberHandle *el = baseClass->members.head; el; el = el->next)
	{
		if(el->variable->name->name == InplaceStr("$typeid"))
			continue;

		skipMembers++;

		if(skipBaseMembers > 0)
		{
			skipBaseMembers--;
			continue;
		}

		bool conflict = CheckVariableConflict(ctx, syntax, el->variable->name->name);

		unsigned offset = AllocateVariableInScope(ctx, syntax, el->variable->alignment, el->variable->type);

		assert(offset == el->variable->offset);

		VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, el->variable->alignment, el->variable->type, el->variable->name, offset, ctx.uniqueVariableId++);

		if(!conflict)
			ctx.AddVariable(member, true);

		newClass->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(el->variable->source, member, NULL));
	}

	// Add padding from base class
	newClass->typeScope->dataSize += baseClass->padding;
	newClass->size += baseClass->padding;

	return skipMembers;
}